

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveInclude(Parser *parser,int flags)

{
  bool bVar1;
  Encoding EVar2;
  int iVar3;
  Token *token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source;
  undefined4 in_register_00000034;
  TextFile *file;
  vector<Expression,_std::allocator<Expression>_> parameters;
  path fileName;
  StringLiteral fileNameParameter;
  string local_310;
  TextFile f;
  
  file = (TextFile *)CONCAT44(in_register_00000034,flags);
  token = Parser::peekToken((Parser *)file,0);
  parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = Parser::parseExpressionList((Parser *)file,&parameters,1,2);
  if (!bVar1) {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    goto LAB_0016d817;
  }
  fileNameParameter._value._M_dataplus._M_p = (pointer)&fileNameParameter._value.field_2;
  fileNameParameter._value._M_string_length = 0;
  fileNameParameter._value.field_2._M_local_buf[0] = '\0';
  bVar1 = Expression::evaluateString
                    (parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                     super__Vector_impl_data._M_start,&fileNameParameter,true);
  if (bVar1) {
    ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>
              ((path *)&f,(filesystem *)&fileNameParameter,source);
    getFullPathName(&fileName,(path *)&f);
    ghc::filesystem::path::~path((path *)&f);
    if ((long)parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
              super__Vector_impl_data._M_start == 0x30) {
      f.stream.super_basic_fstream<char,_std::char_traits<char>_>._0_8_ =
           &f.stream.super_basic_fstream<char,_std::char_traits<char>_>.field_0x10;
      f.stream.super_basic_fstream<char,_std::char_traits<char>_>._8_8_ = 0;
      f.stream.super_basic_fstream<char,_std::char_traits<char>_>._16_1_ = 0;
      bVar1 = Expression::evaluateString
                        (parameters.super__Vector_base<Expression,_std::allocator<Expression>_>.
                         _M_impl.super__Vector_impl_data._M_start + 1,(StringLiteral *)&f,true);
      if (bVar1) {
        EVar2 = getEncodingFromString((string *)&f);
      }
      else {
        (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        EVar2 = GUESS;
      }
      std::__cxx11::string::~string((string *)&f);
      if (bVar1) goto LAB_0016d72b;
    }
    else {
      EVar2 = GUESS;
LAB_0016d72b:
      if (*(char *)(*(long *)&(file->stream).super_basic_fstream<char,_std::char_traits<char>_>.
                              field_0xa0 + -2) == '\0') {
        std::make_unique<DummyCommand>();
        (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)f.stream.super_basic_fstream<char,_std::char_traits<char>_>._0_8_;
      }
      else {
        bVar1 = ghc::filesystem::exists(&fileName);
        if (bVar1) {
          TextFile::TextFile(&f);
          iVar3 = TextFile::open(&f,(char *)&fileName,0,EVar2);
          if ((char)iVar3 == '\0') {
            ghc::filesystem::path::u8string_abi_cxx11_(&local_310,&fileName);
            Parser::printError<std::__cxx11::string>
                      ((Parser *)file,token,"Could not open included file \"%s\"",&local_310);
            std::__cxx11::string::~string((string *)&local_310);
            (parser->entries).
            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
          }
          else {
            Parser::parseFile(parser,file,SUB81(&f,0));
          }
          TextFile::~TextFile(&f);
        }
        else {
          ghc::filesystem::path::u8string_abi_cxx11_((string *)&f,&fileName);
          Parser::printError<std::__cxx11::string>
                    ((Parser *)file,token,"Included file \"%s\" does not exist",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
          std::__cxx11::string::~string((string *)&f);
          (parser->entries).
          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
        }
      }
    }
    ghc::filesystem::path::~path(&fileName);
  }
  else {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  std::__cxx11::string::~string((string *)&fileNameParameter);
LAB_0016d817:
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&parameters);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveInclude(Parser& parser, int flags)
{
	const Token& start = parser.peekToken();

	std::vector<Expression> parameters;
	if (!parser.parseExpressionList(parameters,1,2))
		return nullptr;

	StringLiteral fileNameParameter;
	if (!parameters[0].evaluateString(fileNameParameter,true))
		return nullptr;

	auto fileName = getFullPathName(fileNameParameter.path());

	TextFile::Encoding encoding = TextFile::GUESS;
	if (parameters.size() == 2)
	{
		StringLiteral encodingName;
		if (!parameters[1].evaluateString(encodingName,true))
			return nullptr;
		
		encoding = getEncodingFromString(encodingName.string());
	}

	// don't include the file if it's inside a false block
	if (!parser.isInsideTrueBlock())
		return std::make_unique<DummyCommand>();

	if (!fs::exists(fileName))
	{
		parser.printError(start, "Included file \"%s\" does not exist",fileName.u8string());
		return nullptr;
	}

	TextFile f;
	if (!f.open(fileName,TextFile::Read,encoding))
	{
		parser.printError(start, "Could not open included file \"%s\"",fileName.u8string());
		return nullptr;
	}

	return parser.parseFile(f);
}